

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O2

int __thiscall asmjit::v1_14::RALocalAllocator::init(RALocalAllocator *this,EVP_PKEY_CTX *ctx)

{
  PhysToWorkMap *pPVar1;
  WorkToPhysMap *pWVar2;
  WorkToPhysMap *pWVar3;
  int iVar4;
  
  pPVar1 = BaseRAPass::newPhysToWorkMap(this->_pass);
  pWVar2 = BaseRAPass::newWorkToPhysMap(this->_pass);
  iVar4 = 1;
  if (pWVar2 != (WorkToPhysMap *)0x0 && pPVar1 != (PhysToWorkMap *)0x0) {
    RAAssignment::initLayout
              (&this->_curAssignment,&this->_pass->_physRegCount,&this->_pass->_workRegs);
    RAAssignment::initMaps(&this->_curAssignment,pPVar1,pWVar2);
    pPVar1 = BaseRAPass::newPhysToWorkMap(this->_pass);
    pWVar2 = BaseRAPass::newWorkToPhysMap(this->_pass);
    pWVar3 = BaseRAPass::newWorkToPhysMap(this->_pass);
    this->_tmpWorkToPhysMap = pWVar3;
    if (pWVar3 != (WorkToPhysMap *)0x0 &&
        (pWVar2 != (WorkToPhysMap *)0x0 && pPVar1 != (PhysToWorkMap *)0x0)) {
      RAAssignment::initLayout
                (&this->_tmpAssignment,&this->_pass->_physRegCount,&this->_pass->_workRegs);
      RAAssignment::initMaps(&this->_tmpAssignment,pPVar1,pWVar2);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

Error RALocalAllocator::init() noexcept {
  PhysToWorkMap* physToWorkMap;
  WorkToPhysMap* workToPhysMap;

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  if (!physToWorkMap || !workToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _curAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _curAssignment.initMaps(physToWorkMap, workToPhysMap);

  physToWorkMap = _pass->newPhysToWorkMap();
  workToPhysMap = _pass->newWorkToPhysMap();
  _tmpWorkToPhysMap = _pass->newWorkToPhysMap();

  if (!physToWorkMap || !workToPhysMap || !_tmpWorkToPhysMap)
    return DebugUtils::errored(kErrorOutOfMemory);

  _tmpAssignment.initLayout(_pass->_physRegCount, _pass->workRegs());
  _tmpAssignment.initMaps(physToWorkMap, workToPhysMap);

  return kErrorOk;
}